

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O1

void __thiscall
embree::sse2::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::VirtualRecalculatePrimRef,_2UL>::
TemporalBinInfo::bin
          (TemporalBinInfo *this,PrimRefMB *prims,size_t begin,size_t end,BBox1f time_range,
          SetMB *set,VirtualRecalculatePrimRef *recalculatePrimRef)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Geometry *pGVar3;
  float *pfVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  undefined8 in_XMM0_Qb;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  LBBox3fa bn0;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_a8 = time_range.upper;
  local_b8._8_4_ = (int)in_XMM0_Qb;
  local_b8._0_8_ = time_range;
  local_b8._12_4_ = (int)((ulong)in_XMM0_Qb >> 0x20);
  fVar11 = (set->super_PrimInfoMB).max_time_range.lower;
  fVar10 = (set->super_PrimInfoMB).max_time_range.upper - fVar11;
  fVar7 = (float)(set->super_PrimInfoMB).max_num_time_segments;
  fStack_a4 = local_a8;
  fStack_a0 = local_a8;
  fStack_9c = local_a8;
  fVar6 = roundf((((time_range.lower * 0.5 + local_a8 * 0.5) - fVar11) / fVar10) * fVar7);
  fVar11 = (fVar6 / fVar7) * fVar10 + fVar11;
  if ((((float)local_b8._0_4_ < fVar11) && (fVar11 < local_a8)) &&
     (lVar5 = end - begin, begin <= end && lVar5 != 0)) {
    local_48 = (float)local_b8._0_4_;
    uStack_40 = local_b8._8_4_;
    uStack_3c = local_b8._12_4_;
    uStack_54 = local_b8._4_4_;
    uStack_50 = local_b8._8_4_;
    uStack_4c = local_b8._12_4_;
    pfVar4 = &prims[begin].time_range.upper;
    local_58 = fVar11;
    fStack_44 = fVar11;
    do {
      if (((float)local_b8._0_4_ < *pfVar4 * 0.9999) &&
         (((BBox1f *)(pfVar4 + -1))->lower * 1.0001 < fVar11)) {
        local_c0 = CONCAT44(fStack_44,local_48);
        pGVar3 = (recalculatePrimRef->scene->geometries).items[(uint)pfVar4[-0xe]].ptr;
        (*(pGVar3->super_RefCount)._vptr_RefCount[0x3d])
                  (local_98,pGVar3,(ulong)(uint)pfVar4[-10],&local_c0,recalculatePrimRef->sgrids);
        aVar9 = this->bounds0[0].bounds0.upper.field_0;
        aVar1 = this->bounds0[0].bounds1.lower.field_0;
        aVar8.m128 = (__m128)minps(this->bounds0[0].bounds0.lower.field_0,local_98);
        aVar2 = this->bounds0[0].bounds1.upper.field_0;
        this->bounds0[0].bounds0.lower.field_0 = aVar8;
        aVar9.m128 = (__m128)maxps(aVar9.m128,local_88);
        this->bounds0[0].bounds0.upper.field_0 = aVar9;
        aVar9.m128 = (__m128)minps(aVar1.m128,local_78);
        this->bounds0[0].bounds1.lower.field_0 = aVar9;
        aVar9.m128 = (__m128)maxps(aVar2.m128,local_68);
        this->bounds0[0].bounds1.upper.field_0 = aVar9;
        fVar13 = (float)(uint)pfVar4[-2];
        fVar10 = (*(BBox1f *)(pfVar4 + -1)).lower;
        fVar12 = (*(BBox1f *)(pfVar4 + -1)).upper - fVar10;
        fVar7 = floorf((((float)local_b8._0_4_ - fVar10) / fVar12) * 1.0000002 * fVar13);
        fVar6 = 0.0;
        if (0.0 <= fVar7) {
          fVar6 = fVar7;
        }
        fVar7 = ceilf(((fVar11 - fVar10) / fVar12) * 0.99999976 * fVar13);
        if (fVar13 <= fVar7) {
          fVar7 = fVar13;
        }
        this->count0[0] = this->count0[0] + (long)((int)fVar7 - (int)fVar6);
      }
      if ((fVar11 < *pfVar4 * 0.9999) && (((BBox1f *)(pfVar4 + -1))->lower * 1.0001 < local_a8)) {
        local_c0 = CONCAT44(uStack_54,local_58);
        pGVar3 = (recalculatePrimRef->scene->geometries).items[(uint)pfVar4[-0xe]].ptr;
        (*(pGVar3->super_RefCount)._vptr_RefCount[0x3d])
                  (local_98,pGVar3,(ulong)(uint)pfVar4[-10],&local_c0,recalculatePrimRef->sgrids);
        aVar9 = this->bounds1[0].bounds0.upper.field_0;
        aVar1 = this->bounds1[0].bounds1.lower.field_0;
        aVar8.m128 = (__m128)minps(this->bounds1[0].bounds0.lower.field_0,local_98);
        aVar2 = this->bounds1[0].bounds1.upper.field_0;
        this->bounds1[0].bounds0.lower.field_0 = aVar8;
        aVar9.m128 = (__m128)maxps(aVar9.m128,local_88);
        this->bounds1[0].bounds0.upper.field_0 = aVar9;
        aVar9.m128 = (__m128)minps(aVar1.m128,local_78);
        this->bounds1[0].bounds1.lower.field_0 = aVar9;
        aVar9.m128 = (__m128)maxps(aVar2.m128,local_68);
        this->bounds1[0].bounds1.upper.field_0 = aVar9;
        fVar13 = (float)(uint)pfVar4[-2];
        fVar6 = (*(BBox1f *)(pfVar4 + -1)).lower;
        fVar10 = (*(BBox1f *)(pfVar4 + -1)).upper - fVar6;
        fVar12 = local_a8 - fVar6;
        fVar7 = floorf(((fVar11 - fVar6) / fVar10) * 1.0000002 * fVar13);
        fVar6 = 0.0;
        if (0.0 <= fVar7) {
          fVar6 = fVar7;
        }
        fVar7 = ceilf((fVar12 / fVar10) * 0.99999976 * fVar13);
        if (fVar13 <= fVar7) {
          fVar7 = fVar13;
        }
        this->count1[0] = this->count1[0] + (long)((int)fVar7 - (int)fVar6);
      }
      pfVar4 = pfVar4 + 0x14;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  return;
}

Assistant:

void bin(const PrimRefMB* prims, size_t begin, size_t end, BBox1f time_range, const SetMB& set, const RecalculatePrimRef& recalculatePrimRef)
          {
            for (int b=0; b<BINS-1; b++)
            {
              const float t = float(b+1)/float(BINS);
              const float ct = lerp(time_range.lower,time_range.upper,t);
              const float center_time = set.align_time(ct);
              if (center_time <= time_range.lower) continue;
              if (center_time >= time_range.upper) continue;
              const BBox1f dt0(time_range.lower,center_time);
              const BBox1f dt1(center_time,time_range.upper);
              
              /* find linear bounds for both time segments */
              for (size_t i=begin; i<end; i++) 
              {
                if (prims[i].time_range_overlap(dt0))
                {
                  const LBBox3fa bn0 = recalculatePrimRef.linearBounds(prims[i],dt0);
#if MBLUR_BIN_LBBOX
                  bounds0[b].extend(bn0);
#else
                  bounds0[b].extend(bn0.interpolate(0.5f));
#endif
                  count0[b] += prims[i].timeSegmentRange(dt0).size();
                }

                if (prims[i].time_range_overlap(dt1))
                {
                  const LBBox3fa bn1 = recalculatePrimRef.linearBounds(prims[i],dt1);
#if MBLUR_BIN_LBBOX
                  bounds1[b].extend(bn1);
#else
                  bounds1[b].extend(bn1.interpolate(0.5f));
#endif
                  count1[b] += prims[i].timeSegmentRange(dt1).size();
                }
              }
            }
          }